

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void StoreVarLenUint8(size_t n,size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (n == 0) {
    uVar1 = *storage_ix;
    uVar4 = uVar1 >> 3;
    *(ulong *)(storage + uVar4) = (ulong)storage[uVar4];
    sVar5 = uVar1 + 1;
  }
  else {
    uVar3 = 0x1f;
    if ((uint)n != 0) {
      for (; (uint)n >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar2 = *storage_ix;
    uVar1 = uVar2 + 1;
    uVar4 = uVar2 + 4;
    sVar5 = uVar2 + uVar3 + 4;
    *(ulong *)(storage + (uVar2 >> 3)) = (ulong)storage[uVar2 >> 3] | 1L << ((byte)uVar2 & 7);
    *storage_ix = uVar1;
    *(ulong *)(storage + (uVar1 >> 3)) =
         (ulong)uVar3 << ((byte)uVar1 & 7) | (ulong)storage[uVar1 >> 3];
    *storage_ix = uVar4;
    *(size_t *)(storage + (uVar4 >> 3)) =
         (-1L << ((byte)uVar3 & 0x3f)) + n << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
  }
  *storage_ix = sVar5;
  return;
}

Assistant:

static void StoreVarLenUint8(size_t n, size_t* storage_ix, uint8_t* storage) {
  if (n == 0) {
    BrotliWriteBits(1, 0, storage_ix, storage);
  } else {
    size_t nbits = Log2FloorNonZero(n);
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(3, nbits, storage_ix, storage);
    BrotliWriteBits(nbits, n - ((size_t)1 << nbits), storage_ix, storage);
  }
}